

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.h
# Opt level: O3

double * __thiscall Matrix<double,_3,_1>::operator()(Matrix<double,_3,_1> *this,int row,int col)

{
  int iVar1;
  ostream *poVar2;
  int iVar3;
  
  if ((row < this->rows) && (iVar1 = this->cols, col < iVar1)) {
    iVar3 = iVar1 * row + col;
    if (iVar1 == 1) {
      iVar3 = row;
    }
    if (this->rows == 1) {
      iVar3 = col;
    }
    return this->data + iVar3;
  }
  poVar2 = std::operator<<((ostream *)&std::cerr,
                           "assertion occurred! fail to find the element, please check");
  std::endl<char,std::char_traits<char>>(poVar2);
  exit(-1);
}

Assistant:

Type & Matrix<Type, _0, _1>::operator()(const int row, const int col) const
{
    if(row >= this->rows || col >= this->cols)
    {
        cerr << "assertion occurred! fail to find the element, please check" << endl;
        exit(-1);
    }

    // to get the position of the element
    int position = row * this->cols + col;

    // vector
    if(this->cols == 1)
        position = row;
    if(this->rows == 1)
        position = col;

    return (this->data[position]);
}